

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

int xcb_input_input_state_data_unpack
              (void *_buffer,uint8_t class_id,xcb_input_input_state_data_t *_aux)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  undefined7 in_register_00000031;
  
  iVar7 = (int)CONCAT71(in_register_00000031,class_id);
  if (iVar7 == 2) {
    bVar1 = *_buffer;
    (_aux->valuator).num_valuators = bVar1;
    (_aux->valuator).mode = *(uint8_t *)((long)_buffer + 1);
    (_aux->valuator).valuators = (int32_t *)((long)_buffer + 2);
    iVar8 = (uint)bVar1 << 2;
    iVar5 = 0;
    uVar6 = 3;
    iVar7 = 2;
  }
  else {
    iVar5 = -2;
    if (iVar7 == 1) {
      (_aux->button).num_buttons = *_buffer;
      (_aux->button).pad1 = *(uint8_t *)((long)_buffer + 1);
      uVar2 = *(undefined8 *)((long)_buffer + 10);
      uVar3 = *(undefined8 *)((long)_buffer + 0x12);
      uVar4 = *(undefined8 *)((long)_buffer + 0x1a);
      *(undefined8 *)(_aux->button).buttons = *(undefined8 *)((long)_buffer + 2);
      *(undefined8 *)((_aux->button).buttons + 8) = uVar2;
      *(undefined8 *)((_aux->button).buttons + 0x10) = uVar3;
      *(undefined8 *)((_aux->button).buttons + 0x18) = uVar4;
    }
    else {
      if (iVar7 != 0) {
        uVar6 = 0xffffffff;
        iVar7 = 0;
        iVar8 = 0;
        goto LAB_001887e3;
      }
      (_aux->key).num_keys = *_buffer;
      (_aux->key).pad0 = *(uint8_t *)((long)_buffer + 1);
      uVar2 = *(undefined8 *)((long)_buffer + 10);
      uVar3 = *(undefined8 *)((long)_buffer + 0x12);
      uVar4 = *(undefined8 *)((long)_buffer + 0x1a);
      *(undefined8 *)(_aux->key).keys = *(undefined8 *)((long)_buffer + 2);
      *(undefined8 *)((_aux->key).keys + 8) = uVar2;
      *(undefined8 *)((_aux->key).keys + 0x10) = uVar3;
      *(undefined8 *)((_aux->key).keys + 0x18) = uVar4;
    }
    iVar8 = 0x22;
    iVar7 = 0;
    uVar6 = 0;
  }
LAB_001887e3:
  return iVar7 + iVar8 + (iVar5 - iVar8 & uVar6);
}

Assistant:

int
xcb_input_input_state_data_unpack (const void                    *_buffer,
                                   uint8_t                        class_id,
                                   xcb_input_input_state_data_t  *_aux)
{
    char *xcb_tmp = (char *)_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_block_len = 0;
    unsigned int xcb_pad = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 2;


    if(class_id == XCB_INPUT_INPUT_CLASS_KEY) {
        /* xcb_input_input_state_data_t.key.num_keys */
        _aux->key.num_keys = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.pad0 */
        _aux->key.pad0 = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.keys */
        memcpy(_aux->key.keys, xcb_tmp, sizeof(uint8_t) * 32);
        xcb_block_len += sizeof(uint8_t) * 32;
        xcb_tmp += sizeof(uint8_t) * 32;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_BUTTON) {
        /* xcb_input_input_state_data_t.button.num_buttons */
        _aux->button.num_buttons = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.pad1 */
        _aux->button.pad1 = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.buttons */
        memcpy(_aux->button.buttons, xcb_tmp, sizeof(uint8_t) * 32);
        xcb_block_len += sizeof(uint8_t) * 32;
        xcb_tmp += sizeof(uint8_t) * 32;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_VALUATOR) {
        /* xcb_input_input_state_data_t.valuator.num_valuators */
        _aux->valuator.num_valuators = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.valuator.mode */
        _aux->valuator.mode = *(uint8_t *)xcb_tmp;
        xcb_block_len += sizeof(uint8_t);
        xcb_tmp += sizeof(uint8_t);
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_tmp += xcb_pad;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* valuators */
        _aux->valuator.valuators = (int32_t *)xcb_tmp;
        xcb_block_len += _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_tmp += xcb_block_len;
        xcb_align_to = ALIGNOF(int32_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_tmp += xcb_pad;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    return xcb_buffer_len;
}